

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_fixed.cc
# Opt level: O3

string * __thiscall
absl::time_internal::cctz::FixedOffsetToName_abi_cxx11_
          (string *__return_storage_ptr__,cctz *this,seconds *offset)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  char cVar4;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  int iVar8;
  char cVar9;
  uint uVar10;
  char cVar11;
  char buf [19];
  char local_28 [10];
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  undefined1 local_18;
  undefined1 local_17;
  undefined1 local_16;
  
  pcVar7 = local_28;
  lVar1 = *(long *)this;
  if ((lVar1 == 0) || (lVar1 - 0x15181U < 0xfffffffffffd5cff)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar7 = "UTC";
    pcVar5 = "";
  }
  else {
    iVar6 = (int)lVar1;
    local_28[9] = ((char)((ulong)lVar1 >> 0x18) >> 7) * -2 + '+';
    iVar8 = iVar6 / 0x3c;
    iVar2 = iVar6 % 0x3c;
    if (iVar6 < 0) {
      iVar6 = iVar2 + -0x3c;
      if (iVar2 < 1) {
        iVar6 = iVar2;
      }
      iVar8 = -((uint)(0 < iVar2) + iVar8);
      iVar2 = -iVar6;
    }
    uVar10 = ((uint)((short)iVar8 * -0x7777) >> 0x10) + iVar8;
    cVar11 = (char)((short)uVar10 >> 5) + (char)((uVar10 & 0xffff) >> 0xf);
    cVar4 = (char)iVar8 + cVar11 * -0x3c;
    builtin_strncpy(local_28,"Fixed/UTC",9);
    cVar9 = (char)((uint)(int)(short)(cVar11 * 0x67) >> 10) - (cVar11 >> 7);
    local_1e = (anonymous_namespace)::kDigits[cVar9];
    local_1d = (anonymous_namespace)::kDigits[(char)(cVar11 + cVar9 * -10)];
    local_1c = 0x3a;
    cVar11 = (char)((uint)(int)(short)(cVar4 * 0x67) >> 10) - (cVar4 >> 7);
    local_1b = (anonymous_namespace)::kDigits[cVar11];
    local_1a = (anonymous_namespace)::kDigits[(char)(cVar4 + cVar11 * -10)];
    local_19 = 0x3a;
    cVar11 = (char)iVar2;
    cVar4 = (char)((uint)(int)(short)(cVar11 * 0x67) >> 10) - (cVar11 >> 7);
    local_18 = (anonymous_namespace)::kDigits[cVar4];
    local_17 = (anonymous_namespace)::kDigits[(char)(cVar11 + cVar4 * -10)];
    local_16 = 0;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(local_28);
    pcVar5 = local_28 + sVar3;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar7,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

std::string FixedOffsetToName(const seconds& offset) {
  if (offset == seconds::zero()) return "UTC";
  if (offset < std::chrono::hours(-24) || offset > std::chrono::hours(24)) {
    // We don't support fixed-offset zones more than 24 hours
    // away from UTC to avoid complications in rendering such
    // offsets and to (somewhat) limit the total number of zones.
    return "UTC";
  }
  int offset_seconds = static_cast<int>(offset.count());
  const char sign = (offset_seconds < 0 ? '-' : '+');
  int offset_minutes = offset_seconds / 60;
  offset_seconds %= 60;
  if (sign == '-') {
    if (offset_seconds > 0) {
      offset_seconds -= 60;
      offset_minutes += 1;
    }
    offset_seconds = -offset_seconds;
    offset_minutes = -offset_minutes;
  }
  int offset_hours = offset_minutes / 60;
  offset_minutes %= 60;
  const std::size_t prefix_len = sizeof(kFixedZonePrefix) - 1;
  char buf[prefix_len + sizeof("-24:00:00")];
  char* ep = std::copy(kFixedZonePrefix, kFixedZonePrefix + prefix_len, buf);
  *ep++ = sign;
  ep = Format02d(ep, offset_hours);
  *ep++ = ':';
  ep = Format02d(ep, offset_minutes);
  *ep++ = ':';
  ep = Format02d(ep, offset_seconds);
  *ep++ = '\0';
  assert(ep == buf + sizeof(buf));
  return buf;
}